

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O2

Iterator __thiscall Js::JavascriptMap::GetIterator(JavascriptMap *this)

{
  Type extraout_RDX;
  long in_RSI;
  Iterator IVar1;
  
  MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  ::Iterator::Iterator
            ((Iterator *)this,
             (MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
              *)(in_RSI + 0x20));
  IVar1.current.ptr = extraout_RDX.ptr;
  IVar1.list.ptr =
       (MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
        *)this;
  return IVar1;
}

Assistant:

JavascriptMap::MapDataList::Iterator JavascriptMap::GetIterator()
{
    return list.GetIterator();
}